

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_test.c
# Opt level: O0

void ec_sync(int64 reftime,int64 cycletime,int64 *offsettime)

{
  undefined8 local_28;
  int64 delta;
  int64 *offsettime_local;
  int64 cycletime_local;
  int64 reftime_local;
  
  local_28 = (reftime + -50000) % cycletime;
  if (cycletime / 2 < local_28) {
    local_28 = local_28 - cycletime;
  }
  if (0 < local_28) {
    ec_sync::integral = ec_sync::integral + 1;
  }
  if (local_28 < 0) {
    ec_sync::integral = ec_sync::integral + -1;
  }
  *offsettime = -(ec_sync::integral / 0x14) - local_28 / 100;
  gl_delta = local_28;
  return;
}

Assistant:

void ec_sync(int64 reftime, int64 cycletime , int64 *offsettime)
{
   static int64 integral = 0;
   int64 delta;
   /* set linux sync point 50us later than DC sync, just as example */
   delta = (reftime - 50000) % cycletime;
   if(delta> (cycletime / 2)) { delta= delta - cycletime; }
   if(delta>0){ integral++; }
   if(delta<0){ integral--; }
   *offsettime = -(delta / 100) - (integral / 20);
   gl_delta = delta;
}